

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitLocalSet(FunctionValidator *this,LocalSet *curr)

{
  uint uVar1;
  bool bVar2;
  Function *pFVar3;
  size_t sVar4;
  Type TVar5;
  Type right;
  BasicType local_20 [2];
  LocalSet *local_18;
  LocalSet *curr_local;
  FunctionValidator *this_local;
  
  uVar1 = curr->index;
  local_18 = curr;
  curr_local = (LocalSet *)this;
  pFVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
           getFunction(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
  sVar4 = Function::getNumLocals(pFVar3);
  bVar2 = shouldBeTrue<wasm::LocalSet*>
                    (this,uVar1 < sVar4,local_18,"local.set index must be small enough");
  if (bVar2) {
    local_20[1] = 1;
    bVar2 = wasm::Type::operator!=(&local_18->value->type,local_20 + 1);
    if (bVar2) {
      local_20[0] = none;
      bVar2 = wasm::Type::operator!=
                        (&(local_18->super_SpecificExpression<(wasm::Expression::Id)9>).
                          super_Expression.type,local_20);
      if (bVar2) {
        pFVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
                 getFunction(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                              ).
                              super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                              .
                              super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            );
        TVar5 = Function::getLocalType(pFVar3,local_18->index);
        shouldBeEqual<wasm::LocalSet*,wasm::Type>
                  (this,TVar5,
                   (Type)(local_18->super_SpecificExpression<(wasm::Expression::Id)9>).
                         super_Expression.type.id,local_18,"local.set type must be correct");
      }
      TVar5.id = (local_18->value->type).id;
      pFVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
               getFunction(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                            ).
                            super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            .
                            super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          );
      right = Function::getLocalType(pFVar3,local_18->index);
      shouldBeSubType(this,TVar5,right,(Expression *)local_18,
                      "local.set\'s value type must be correct");
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitLocalSet(LocalSet* curr) {
  if (shouldBeTrue(curr->index < getFunction()->getNumLocals(),
                   curr,
                   "local.set index must be small enough")) {
    if (curr->value->type != Type::unreachable) {
      if (curr->type != Type::none) { // tee is ok anyhow
        shouldBeEqual(getFunction()->getLocalType(curr->index),
                      curr->type,
                      curr,
                      "local.set type must be correct");
      }
      shouldBeSubType(curr->value->type,
                      getFunction()->getLocalType(curr->index),
                      curr,
                      "local.set's value type must be correct");
    }
  }
}